

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O2

char * GetBailOutKindName(BailOutKind kind)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  undefined4 *puVar5;
  BailOutKind BVar6;
  size_t position;
  char *pcVar7;
  
  if (kind < BailOutOnOverflow) {
    pcVar7 = BailOutKindNames[kind];
  }
  else {
    BVar6 = kind & ~BailOutKindBits;
    if ((kind & ~BailOutKindBits) == BailOutInvalid) {
      position = 0;
    }
    else {
      kind = kind & BailOutKindBits;
      iVar3 = sprintf_s(GetBailOutKindName::name,0x200,"%s",BailOutKindNames[BVar6]);
      position = (size_t)iVar3;
    }
    if ((kind >> 10 & 1) != 0) {
      kind = kind & ~BailOutOnOverflow;
      sVar4 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,position,1);
      position = position + sVar4;
    }
    if ((kind >> 0xb & 1) != 0) {
      kind = kind & ~BailOutOnMulOverflow;
      sVar4 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,position,2);
      position = position + sVar4;
    }
    if ((kind >> 0xc & 1) != 0) {
      kind = kind & ~BailOutOnNegativeZero;
      sVar4 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,position,3);
      position = position + sVar4;
    }
    if ((kind >> 0xd & 1) != 0) {
      kind = kind & ~BailOutOnPowIntIntOverflow;
      sVar4 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,position,4);
      position = position + sVar4;
    }
    if ((kind >> 0xe & 1) != 0) {
      kind = kind & ~BailOutOnMissingValue;
      sVar4 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,position,6);
      position = position + sVar4;
    }
    if ((short)kind < 0) {
      kind = kind & ~BailOutConventionalNativeArrayAccessOnly;
      sVar4 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,position,7);
      position = position + sVar4;
    }
    if ((kind >> 0x10 & 1) != 0) {
      kind = kind & ~BailOutConvertedNativeArray;
      sVar4 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,position,8);
      position = position + sVar4;
    }
    if ((kind >> 0x11 & 1) != 0) {
      kind = kind & ~BailOutOnArrayAccessHelperCall;
      sVar4 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,position,9);
      position = position + sVar4;
    }
    if ((kind >> 0x12 & 1) != 0) {
      kind = kind & ~BailOutOnInvalidatedArrayHeadSegment;
      sVar4 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,position,10);
      position = position + sVar4;
    }
    if ((kind >> 0x13 & 1) != 0) {
      kind = kind & ~BailOutOnInvalidatedArrayLength;
      sVar4 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,position,0xb);
      position = position + sVar4;
    }
    if ((kind >> 0x14 & 1) != 0) {
      kind = kind & ~BailOnStackArgsOutOfActualsRange;
      sVar4 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,position,0xc);
      position = position + sVar4;
    }
    if ((kind >> 0x15 & 1) != 0) {
      kind = kind & ~BailOutForceByFlag;
      sVar4 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,position,0xe);
      position = position + sVar4;
    }
    if ((kind >> 0x16 & 1) != 0) {
      kind = kind & ~BailOutBreakPointInFunction;
      sVar4 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,position,0xf);
      position = position + sVar4;
    }
    if ((kind >> 0x17 & 1) != 0) {
      kind = kind & ~BailOutStackFrameBase;
      sVar4 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,position,0x10);
      position = position + sVar4;
    }
    if ((kind >> 0x18 & 1) != 0) {
      kind = kind & ~BailOutLocalValueChanged;
      sVar4 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,position,0x11);
      position = position + sVar4;
    }
    if ((kind >> 0x19 & 1) != 0) {
      kind = kind & ~BailOutExplicit;
      sVar4 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,position,0x12);
      position = position + sVar4;
    }
    if ((kind >> 0x1a & 1) != 0) {
      kind = kind & ~BailOutStep;
      sVar4 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,position,0x13);
      position = position + sVar4;
    }
    if ((kind >> 0x1b & 1) != 0) {
      kind = kind & ~BailOutIgnoreException;
      sVar4 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,position,0x14);
      position = position + sVar4;
    }
    if ((kind >> 0x1c & 1) != 0) {
      kind = kind & ~BailOutOnDivByZero;
      sVar4 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,position,0x16);
      position = position + sVar4;
    }
    if ((kind >> 0x1d & 1) != 0) {
      kind = kind & ~BailOutOnDivOfMinInt;
      sVar4 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,position,0x17);
      position = position + sVar4;
    }
    if ((kind >> 0x1e & 1) != 0) {
      kind = kind & ~BailOutMarkTempObject;
      sVar4 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,position,0x19);
      position = position + sVar4;
    }
    if ((int)kind < 0) {
      kind = kind & ~LazyBailOut;
      sVar4 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,position,0x1a);
      position = position + sVar4;
    }
    if (position == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                         ,0xb65,"(position != 0)","position != 0");
      if (!bVar2) goto LAB_0088b99b;
      *puVar5 = 0;
    }
    pcVar7 = GetBailOutKindName::name;
    if (kind != BailOutInvalid) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                         ,0xb66,"(!kind)","!kind");
      if (!bVar2) {
LAB_0088b99b:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
  }
  return pcVar7;
}

Assistant:

const char* GetBailOutKindName(IR::BailOutKind kind)
{
    using namespace IR;

    if (!(kind & BailOutKindBits))
    {
        return BailOutKindNames[kind];
    }

    static char name[512];
    size_t position = 0;
    const auto normalKind = kind & ~BailOutKindBits;
    if (normalKind != 0)
    {
        kind -= normalKind;
        position +=
            sprintf_s(
                &name[position],
                sizeof(name) / sizeof(name[0]) - position * sizeof(name[0]),
                position == 0 ? "%s" : " | %s",
                BailOutKindNames[normalKind]);
    }

    uint offset = 1;
    if (kind & BailOutOnOverflow)
    {
        kind ^= BailOutOnOverflow;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutOnMulOverflow)
    {
        kind ^= BailOutOnMulOverflow;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutOnNegativeZero)
    {
        kind ^= BailOutOnNegativeZero;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutOnPowIntIntOverflow)
    {
        kind ^= BailOutOnPowIntIntOverflow;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    // BailOutOnResultConditions

    ++offset;
    if (kind & BailOutOnMissingValue)
    {
        kind ^= BailOutOnMissingValue;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutConventionalNativeArrayAccessOnly)
    {
        kind ^= BailOutConventionalNativeArrayAccessOnly;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutConvertedNativeArray)
    {
        kind ^= BailOutConvertedNativeArray;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutOnArrayAccessHelperCall)
    {
        kind ^= BailOutOnArrayAccessHelperCall;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutOnInvalidatedArrayHeadSegment)
    {
        kind ^= BailOutOnInvalidatedArrayHeadSegment;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutOnInvalidatedArrayLength)
    {
        kind ^= BailOutOnInvalidatedArrayLength;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOnStackArgsOutOfActualsRange)
    {
        kind ^= BailOnStackArgsOutOfActualsRange;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    // BailOutForArrayBits

    ++offset;
    if (kind & BailOutForceByFlag)
    {
        kind ^= BailOutForceByFlag;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutBreakPointInFunction)
    {
        kind ^= BailOutBreakPointInFunction;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutStackFrameBase)
    {
        kind ^= BailOutStackFrameBase;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutLocalValueChanged)
    {
        kind ^= BailOutLocalValueChanged;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutExplicit)
    {
        kind ^= BailOutExplicit;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutStep)
    {
        kind ^= BailOutStep;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutIgnoreException)
    {
        kind ^= BailOutIgnoreException;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    // BailOutForDebuggerBits

    ++offset;
    if (kind & BailOutOnDivByZero)
    {
        kind ^= BailOutOnDivByZero;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutOnDivOfMinInt)
    {
        kind ^= BailOutOnDivOfMinInt;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    // BailOutOnDivSrcConditions

    ++offset;
    if (kind & BailOutMarkTempObject)
    {
        kind ^= BailOutMarkTempObject;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;

    if (kind & LazyBailOut)
    {
        kind ^= LazyBailOut;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    // BailOutKindBits

    Assert(position != 0);
    Assert(!kind);
    return name;
}